

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmParseTree.cpp
# Opt level: O2

WasmType Wasm::LanguageTypes::ToWasmType(int8 binType)

{
  WasmType WVar1;
  WasmCompilationException *this;
  undefined7 in_register_00000039;
  
  switch((int)CONCAT71(in_register_00000039,binType)) {
  case -5:
    Simd::EnsureSimdIsEnabled();
    WVar1 = V128;
    break;
  case -4:
    WVar1 = F64;
    break;
  case -3:
    WVar1 = F32;
    break;
  case -2:
    WVar1 = I64;
    break;
  case -1:
    WVar1 = FirstLocalType;
    break;
  default:
    this = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this,L"Invalid binary type %d",(ulong)(uint)(int)binType);
    __cxa_throw(this,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  return WVar1;
}

Assistant:

WasmTypes::WasmType LanguageTypes::ToWasmType(int8 binType)
{
    switch (binType)
    {
    case LanguageTypes::i32: return WasmTypes::I32;
    case LanguageTypes::i64: return WasmTypes::I64;
    case LanguageTypes::f32: return WasmTypes::F32;
    case LanguageTypes::f64: return WasmTypes::F64;
#ifdef ENABLE_WASM_SIMD
    case LanguageTypes::v128:
        Simd::EnsureSimdIsEnabled();
        return WasmTypes::V128;
#endif
    default:
        throw WasmCompilationException(_u("Invalid binary type %d"), binType);
    }
}